

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O1

void uv_wtf8_to_utf16(char *source_ptr,uint16_t *w_target,size_t w_target_len)

{
  char *pcVar1;
  char cVar2;
  int32_t iVar3;
  long lVar4;
  char *local_20;
  
  local_20 = source_ptr;
  do {
    iVar3 = uv__wtf8_decode1(&local_20);
    if (iVar3 < 0) {
      __assert_fail("code_point >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                    ,0x18b,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
    }
    if (iVar3 < 0x10001) {
      *w_target = (ushort)iVar3;
      w_target = w_target + 1;
      lVar4 = -1;
    }
    else {
      if (0x10fffe < iVar3) {
        __assert_fail("code_point < 0x10FFFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                      ,0x18d,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
      }
      *w_target = (short)(iVar3 + 0x3ff0000U >> 10) + 0xd800;
      w_target[1] = (ushort)iVar3 & 0x3ff | 0xdc00;
      w_target = w_target + 2;
      lVar4 = -2;
    }
    w_target_len = w_target_len + lVar4;
    pcVar1 = local_20 + 1;
    cVar2 = *local_20;
    local_20 = pcVar1;
  } while (cVar2 != '\0');
  if (w_target_len == 0) {
    return;
  }
  __assert_fail("w_target_len == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                ,0x198,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
}

Assistant:

void uv_wtf8_to_utf16(const char* source_ptr,
                      uint16_t* w_target,
                      size_t w_target_len) {
  int32_t code_point;

  do {
    code_point = uv__wtf8_decode1(&source_ptr);
    /* uv_wtf8_length_as_utf16 should have been called and checked first. */
    assert(code_point >= 0);
    if (code_point > 0x10000) {
      assert(code_point < 0x10FFFF);
      *w_target++ = (((code_point - 0x10000) >> 10) + 0xD800);
      *w_target++ = ((code_point - 0x10000) & 0x3FF) + 0xDC00;
      w_target_len -= 2;
    } else {
      *w_target++ = code_point;
      w_target_len -= 1;
    }
  } while (*source_ptr++);

  (void)w_target_len;
  assert(w_target_len == 0);
}